

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

void replace(char **tmp,wchar_t c)

{
  char *pcVar1;
  char *aptr;
  wchar_t c_local;
  char **tmp_local;
  
  pcVar1 = strrchr(*tmp,c);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strdup(pcVar1 + 1);
    free(*tmp);
    *tmp = pcVar1;
  }
  return;
}

Assistant:

static void
replace(char **tmp, int c)
{
	char *aptr;
	if ((aptr = strrchr(*tmp, c)) == NULL)
		return;
	aptr = strdup(aptr + 1); // XXX: check
	el_free(*tmp);
	*tmp = aptr;
}